

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)>::Matches
          (OnCallSpec<BasicTestExpr<1>_(TestExprBuilder<0,_BasicTestExpr<0>_>)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<TestExprBuilder<0,BasicTestExpr<0>>>>,std::tuple<TestExprBuilder<0,BasicTestExpr<0>>>>
                    ((tuple<testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *)
                     (this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_>_&>::Matches
                      ((MatcherBase<const_std::tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_>_&> *)
                       (this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }